

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O2

int hydro_secretbox_probe_verify(uint8_t *probe,uint8_t *c,size_t c_len,char *ctx,uint8_t *key)

{
  _Bool _Var1;
  uint8_t computed_probe [16];
  
  if (0x23 < c_len) {
    hydro_hash_hash(computed_probe,0x10,c + 0x14,0x10,ctx,key);
    _Var1 = hydro_equal(computed_probe,probe,0x10);
    if (_Var1) {
      return 0;
    }
    hydro_memzero(computed_probe,0x10);
  }
  return -1;
}

Assistant:

int
hydro_secretbox_probe_verify(const uint8_t probe[hydro_secretbox_PROBEBYTES], const uint8_t *c,
                             size_t c_len, const char ctx[hydro_secretbox_CONTEXTBYTES],
                             const uint8_t key[hydro_secretbox_KEYBYTES])
{
    uint8_t        computed_probe[hydro_secretbox_PROBEBYTES];
    const uint8_t *mac;

    if (c_len < hydro_secretbox_HEADERBYTES) {
        return -1;
    }
    mac = &c[hydro_secretbox_SIVBYTES];
    hydro_hash_hash(computed_probe, hydro_secretbox_PROBEBYTES, mac, hydro_secretbox_MACBYTES, ctx,
                    key);
    if (hydro_equal(computed_probe, probe, hydro_secretbox_PROBEBYTES) == 1) {
        return 0;
    }
    hydro_memzero(computed_probe, hydro_secretbox_PROBEBYTES);
    return -1;
}